

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O3

void * worker_thread_get_unique_keys(void *arg)

{
  int iVar1;
  long lVar2;
  void *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar4;
  ulong uVar6;
  os_thread_t *thread_00;
  void *arg_00;
  ulong uVar7;
  undefined1 local_148 [8];
  char vbuf [256];
  undefined8 local_40;
  unsigned_long_long key;
  size_t vsize;
  void *pvVar3;
  undefined8 uVar5;
  
  key = 0;
  if (*(int *)((long)arg + 0x1c) != 0) {
    uVar6 = 0;
    do {
      local_40 = ((ulong)*arg << 0x30) + uVar6;
      uVar5 = *(undefined8 *)((long)arg + 8);
      thread = (os_thread_t *)&stack0xffffffffffffffc0;
      lVar2 = vmemcache_get(uVar5,(os_thread_t *)&stack0xffffffffffffffc0,8,local_148,0x100,0,&key);
      uVar4 = (uint)uVar5;
      if (lVar2 == -1) {
        worker_thread_get_unique_keys_cold_1();
        pvVar3 = extraout_RAX;
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          thread_00 = thread;
          uVar6 = uVar7;
          arg_00 = extraout_RDX;
          do {
            iVar1 = os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                                     *(_func_void_ptr_void_ptr **)((long)arg_00 + 0x20),arg_00);
            pvVar3 = (void *)CONCAT44(extraout_var,iVar1);
            thread_00 = thread_00 + 1;
            arg_00 = (void *)((long)arg_00 + 0x28);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          if (uVar4 != 0) {
            do {
              iVar1 = os_thread_join(thread,(void **)0x0);
              pvVar3 = (void *)CONCAT44(extraout_var_00,iVar1);
              thread = thread + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
        }
        return pvVar3;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)((long)arg + 0x1c));
  }
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_get_unique_keys(void *arg)
{
	struct context *ctx = arg;
	unsigned long long key;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	for (unsigned i = 0; i < ctx->ops_count; i++) {
		key = ((unsigned long long)ctx->thread_number << 48) | i;
		if (vmemcache_get(ctx->cache, &key, sizeof(key),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}